

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::getp_copy_from(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  int iVar2;
  vm_obj_id_t obj;
  ulong uVar3;
  unsigned_long cnt;
  unsigned_long src_idx;
  unsigned_long start_idx;
  
  if (getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar2 != 0) {
      getp_copy_from::desc.min_argc_ = 4;
      getp_copy_from::desc.opt_argc_ = 0;
      getp_copy_from::desc.varargs_ = 0;
      __cxa_guard_release(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_copy_from::desc);
  if (iVar2 == 0) {
    obj = CVmBif::pop_obj_val();
    iVar2 = is_byte_array(obj);
    if (iVar2 == 0) {
      err_throw(0x900);
    }
    pCVar1 = G_obj_table_X.pages_[obj >> 0xc];
    iVar2 = CVmBif::pop_int_val();
    src_idx = 1;
    if (iVar2 != 0) {
      src_idx = (ulong)**(uint **)((long)&pCVar1[obj & 0xfff].ptr_ + 8) + 1;
      if ((ulong)(long)iVar2 <= src_idx) {
        src_idx = (long)iVar2;
      }
    }
    iVar2 = CVmBif::pop_int_val();
    start_idx = 1;
    if (iVar2 != 0) {
      start_idx = (ulong)*(uint *)(this->super_CVmObject).ext_ + 1;
      if ((ulong)(long)iVar2 <= start_idx) {
        start_idx = (long)iVar2;
      }
    }
    iVar2 = CVmBif::pop_int_val();
    uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
    if (uVar3 < start_idx) {
      cnt = 0;
    }
    else {
      cnt = (unsigned_long)iVar2;
      if (uVar3 < (cnt - 1) + start_idx) {
        cnt = (uVar3 - start_idx) + 1;
      }
    }
    save_undo(this,self,start_idx,cnt);
    copy_from(this,start_idx,(CVmObjByteArray *)(pCVar1 + (obj & 0xfff)),src_idx,cnt);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_copy_from(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(4);
    unsigned long dst_idx;
    unsigned long src_idx;
    unsigned long cnt;
    vm_obj_id_t src_arr_id;
    CVmObjByteArray *src_arr;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the source array */
    src_arr_id = CVmBif::pop_obj_val(vmg0_);

    /* make sure it is indeed an array */
    if (!is_byte_array(vmg_ src_arr_id))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* we know it's the right type, so cast it */
    src_arr = (CVmObjByteArray *)vm_objp(vmg_ src_arr_id);

    /* get the starting source index */
    src_idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be in range */
    if (src_idx < 1)
        src_idx = 1;
    else if (src_idx > src_arr->get_element_count() + 1)
        src_idx = src_arr->get_element_count() + 1;

    /* get the destination index */
    dst_idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be within range */
    if (dst_idx < 1)
        dst_idx = 1;
    else if (dst_idx > get_element_count() + 1)
        dst_idx = get_element_count() + 1;

    /* get the count */
    cnt = CVmBif::pop_int_val(vmg0_);

    /* limit the copying to the available destination space */
    if (dst_idx > get_element_count())
        cnt = 0;
    else if (dst_idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - dst_idx;

    /* save undo for the change */
    save_undo(vmg_ self, dst_idx, cnt);

    /* copy the data from the source array into our array */
    copy_from(dst_idx, src_arr, src_idx, cnt);

    /* the result is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}